

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec::GpuCounterDescriptor_GpuCounterSpec
          (GpuCounterDescriptor_GpuCounterSpec *this,GpuCounterDescriptor_GpuCounterSpec *param_1)

{
  GpuCounterDescriptor_GpuCounterSpec *param_1_local;
  GpuCounterDescriptor_GpuCounterSpec *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GpuCounterDescriptor_GpuCounterSpec_009c0d58;
  this->counter_id_ = param_1->counter_id_;
  ::std::__cxx11::string::string((string *)&this->name_,(string *)&param_1->name_);
  ::std::__cxx11::string::string((string *)&this->description_,(string *)&param_1->description_);
  this->int_peak_value_ = param_1->int_peak_value_;
  this->double_peak_value_ = param_1->double_peak_value_;
  std::
  vector<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ::vector(&this->numerator_units_,&param_1->numerator_units_);
  std::
  vector<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ::vector(&this->denominator_units_,&param_1->denominator_units_);
  this->select_by_default_ = (bool)(param_1->select_by_default_ & 1);
  std::
  vector<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ::vector(&this->groups_,&param_1->groups_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

GpuCounterDescriptor_GpuCounterSpec::GpuCounterDescriptor_GpuCounterSpec(GpuCounterDescriptor_GpuCounterSpec&&) noexcept = default;